

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTransaction::SetIssuance
          (ConfidentialTransaction *this,uint32_t tx_in_index,ByteData256 *blinding_nonce,
          ByteData256 *asset_entropy,ConfidentialValue *issuance_amount,
          ConfidentialValue *inflation_keys,ByteData issuance_amount_rangeproof,
          ByteData inflation_keys_rangeproof)

{
  ByteData256 *asset_entropy_00;
  ConfidentialValue *issuance_amount_00;
  ConfidentialValue *inflation_keys_00;
  CfdException *this_00;
  undefined4 in_register_00000034;
  int ret;
  undefined1 local_108 [32];
  ByteData256 *local_e8;
  ConfidentialValue *local_e0;
  ConfidentialValue *local_d8;
  ByteData256 *local_d0;
  void *local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x66f,"SetIssuance");
  local_c8 = (this->super_AbstractTransaction).wally_tx_pointer_;
  local_d0 = blinding_nonce;
  ByteData256::GetBytes(&local_48,blinding_nonce);
  ByteData256::GetBytes(&local_60,asset_entropy);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
             &(issuance_amount->data_).data_);
  ByteData::GetBytes(&local_78,(ByteData *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
             &(inflation_keys->data_).data_);
  ByteData::GetBytes(&local_90,(ByteData *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  ByteData::GetBytes(&local_a8,
                     (ByteData *)
                     issuance_amount_rangeproof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  local_e8 = asset_entropy;
  local_e0 = issuance_amount;
  local_d8 = inflation_keys;
  ByteData::GetBytes(&local_c0,
                     (ByteData *)
                     issuance_amount_rangeproof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  ret = wally_tx_elements_input_issuance_set
                  ((wally_tx_input *)((ulong)tx_in_index * 0xd0 + *(long *)((long)local_c8 + 8)),
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  inflation_keys_00 = local_d8;
  issuance_amount_00 = local_e0;
  asset_entropy_00 = local_e8;
  if (ret == 0) {
    SetElementsTxState(this);
    ConfidentialTxIn::SetIssuance
              ((this->vin_).
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_start + tx_in_index,local_d0,asset_entropy_00,
               issuance_amount_00,inflation_keys_00,
               (ByteData *)
               issuance_amount_rangeproof.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (ByteData *)
               issuance_amount_rangeproof.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_108._0_8_ = "cfdcore_elements_transaction.cpp";
  local_108._8_4_ = 0x687;
  local_108._16_8_ = "SetIssuance";
  logger::log<int&>((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                    "wally_tx_elements_input_issuance_set NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_108._0_8_ = local_108 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"txin add error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_108);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetIssuance(
    // force LF
    uint32_t tx_in_index, const ByteData256 blinding_nonce,
    const ByteData256 asset_entropy, const ConfidentialValue issuance_amount,
    const ConfidentialValue inflation_keys,
    const ByteData issuance_amount_rangeproof,
    const ByteData inflation_keys_rangeproof) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &nonce = blinding_nonce.GetBytes();
  const std::vector<uint8_t> &entropy = asset_entropy.GetBytes();
  const std::vector<uint8_t> &issuance_amount_bytes =
      issuance_amount.GetData().GetBytes();
  const std::vector<uint8_t> &inflation_keys_bytes =
      inflation_keys.GetData().GetBytes();
  const std::vector<uint8_t> &issuance_amount_rangeproof_bytes =
      issuance_amount_rangeproof.GetBytes();
  const std::vector<uint8_t> &inflation_keys_rangeproof_bytes =
      inflation_keys_rangeproof.GetBytes();

  int ret = wally_tx_elements_input_issuance_set(
      &tx_pointer->inputs[tx_in_index], nonce.data(), nonce.size(),
      entropy.data(), entropy.size(), issuance_amount_bytes.data(),
      issuance_amount_bytes.size(), inflation_keys_bytes.data(),
      inflation_keys_bytes.size(), issuance_amount_rangeproof_bytes.data(),
      issuance_amount_rangeproof_bytes.size(),
      inflation_keys_rangeproof_bytes.data(),
      inflation_keys_rangeproof_bytes.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_elements_input_issuance_set NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }
  SetElementsTxState();

  vin_[tx_in_index].SetIssuance(
      blinding_nonce, asset_entropy, issuance_amount, inflation_keys,
      issuance_amount_rangeproof, inflation_keys_rangeproof);
}